

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char cVar1;
  bool bVar2;
  basic_format_specs<char> *pbVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined1 *puVar8;
  uint uVar9;
  _Alloc_hider _Var10;
  uint uVar11;
  basic_format_specs<char> *specs;
  size_type sVar12;
  long lVar13;
  char *size;
  uint uVar14;
  uint uVar15;
  basic_string_view<char> s;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  undefined1 auStack_278 [48];
  undefined1 local_248 [536];
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_00116761;
  }
  uVar4 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (uVar4 == '\0') {
    on_dec(this);
    goto LAB_00116761;
  }
  uVar9 = this->abs_value;
  uVar14 = 0x1f;
  if ((uVar9 | 1) != 0) {
    for (; (uVar9 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar14 = (uVar14 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar15 = (uVar14 + 1) -
           (uint)(uVar9 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar14 * 4));
  _Var10._M_p = local_298._M_dataplus._M_p;
  uVar14 = uVar15;
  uVar5 = uVar15;
  if (local_298._M_string_length == 0) {
LAB_001165e5:
    uVar11 = uVar5;
    uVar6 = uVar14;
    if (_Var10._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_001165f0;
  }
  else {
    uVar11 = uVar15 + (int)local_298._M_string_length;
    sVar12 = local_298._M_string_length;
    do {
      cVar1 = *_Var10._M_p;
      uVar6 = uVar14 - (int)cVar1;
      if ((uVar6 == 0 || (int)uVar14 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82))
      goto LAB_001165e5;
      uVar5 = uVar5 + 1;
      _Var10._M_p = _Var10._M_p + 1;
      sVar12 = sVar12 - 1;
      uVar14 = uVar6;
    } while (sVar12 != 0);
LAB_001165f0:
    uVar11 = (int)(uVar6 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1] +
             uVar11;
  }
  puVar8 = auStack_278 + uVar15;
  uVar14 = uVar9;
  if (99 < uVar9) {
    do {
      uVar14 = uVar9 / 100;
      *(undefined2 *)(puVar8 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar9 % 100) * 2);
      puVar8 = puVar8 + -2;
      bVar2 = 9999 < uVar9;
      uVar9 = uVar9 / 100;
    } while (bVar2);
  }
  if (uVar14 < 10) {
    puVar8[-1] = (byte)uVar14 | 0x30;
  }
  else {
    *(undefined2 *)(puVar8 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar14 * 2);
  }
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_00135cb8;
  local_248._8_8_ = (buffer<char> *)(local_248 + 0x20);
  local_248._24_8_ = 500;
  uVar11 = uVar11 + this->prefix_size;
  size = (char *)(long)(int)uVar11;
  if (500 < uVar11) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,(size_t)size);
  }
  local_248._16_8_ = size;
  specs = (basic_format_specs<char> *)(size + (long)(_func_int ***)local_248._8_8_);
  if (uVar15 != 0) {
    lVar13 = (ulong)uVar15 + 1;
    iVar7 = 0;
    _Var10._M_p = local_298._M_dataplus._M_p;
    do {
      pbVar3 = (basic_format_specs<char> *)&specs[-1].field_0xf;
      specs[-1].field_0xf = auStack_278[(int)lVar13 - 2];
      cVar1 = *_Var10._M_p;
      if ('\0' < cVar1) {
        iVar7 = iVar7 + 1;
        if ((cVar1 != '\x7f') && (iVar7 % (int)cVar1 == 0)) {
          if (_Var10._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
            iVar7 = 0;
            _Var10._M_p = _Var10._M_p + 1;
          }
          specs[-1].fill.size_ = uVar4;
          pbVar3 = (basic_format_specs<char> *)&specs[-1].fill.size_;
        }
      }
      specs = pbVar3;
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  if (this->prefix_size != 0) {
    specs[-1].field_0xf = 0x2d;
  }
  s.size_ = (size_t)this->specs;
  s.data_ = size;
  write<char,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
            ((detail *)(this->out).container,
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_248._8_8_,s,specs);
  local_248._0_8_ = &PTR_grow_00135cb8;
  if ((buffer<char> *)local_248._8_8_ != (buffer<char> *)(local_248 + 0x20)) {
    operator_delete((void *)local_248._8_8_);
  }
LAB_00116761:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(size);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    write(out, basic_string_view<Char>(buffer.data(), buffer.size()), specs);
  }